

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O3

apx_size_t rmf_encode_open_file_cmd(uint8_t *buf,apx_size_t buf_size,uint32_t address)

{
  apx_size_t aVar1;
  
  aVar1 = 0;
  if (7 < buf_size && address < 0x40000000) {
    packLE(buf,10,'\x04');
    packLE(buf + 4,address,'\x04');
    aVar1 = 8;
  }
  return aVar1;
}

Assistant:

apx_size_t rmf_encode_open_file_cmd(uint8_t* buf, apx_size_t buf_size, uint32_t address)
{
   apx_size_t const required_size = RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE;
   if ((address > RMF_HIGH_ADDR_MAX) || (required_size > buf_size))
   {
      return 0;
   }
   uint8_t* p = buf;
   packLE(p, RMF_CMD_OPEN_FILE_MSG, (uint8_t)UINT32_SIZE); p += UINT32_SIZE;
   packLE(p, address, (uint8_t)UINT32_SIZE); p += UINT32_SIZE;
   return required_size;
}